

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfB44Compressor.cpp
# Opt level: O3

int __thiscall
Imf_2_5::B44Compressor::uncompress
          (B44Compressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  long *plVar1;
  byte bVar2;
  char *pcVar3;
  byte bVar4;
  ushort uVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  int i;
  int iVar9;
  uint uVar10;
  const_iterator cVar11;
  const_iterator cVar12;
  ConstIterator CVar13;
  InputExc *this_00;
  ulong uVar14;
  unsigned_short *puVar15;
  int iVar16;
  unsigned_short *puVar17;
  uint uVar18;
  long lVar19;
  size_t sVar20;
  long lVar21;
  ChannelData *pCVar22;
  uint a;
  ushort *__src;
  long lVar23;
  bool bVar24;
  int iVar25;
  int iVar26;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  undefined1 auVar27 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar49;
  int iVar50;
  unsigned_short s [16];
  uint local_f4;
  int local_dc;
  ushort local_d8 [20];
  ushort *local_b0;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  unsigned_short *local_98;
  uint local_8c;
  uint local_88;
  uint local_84;
  ChannelData *local_80;
  unsigned_short *local_78;
  long local_70;
  char **local_68;
  long local_60;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  *outPtr = this->_outBuffer;
  if (inSize == 0) {
    iVar16 = 0;
  }
  else {
    local_9c = (range->min).x;
    iVar16 = (range->max).x;
    if (this->_maxX < iVar16) {
      iVar16 = this->_maxX;
    }
    a = (range->min).y;
    uVar10 = (range->max).y;
    if (this->_maxY < (int)uVar10) {
      uVar10 = this->_maxY;
    }
    puVar17 = this->_tmpBuffer;
    local_b0 = (ushort *)inPtr;
    local_68 = outPtr;
    cVar11._M_node = (_Base_ptr)ChannelList::begin(this->_channels);
    cVar12._M_node = (_Base_ptr)ChannelList::end(this->_channels);
    if (cVar11._M_node != cVar12._M_node) {
      lVar19 = 0;
      do {
        pCVar22 = this->_channelData;
        *(unsigned_short **)((long)&pCVar22->start + lVar19) = puVar17;
        *(unsigned_short **)((long)&pCVar22->end + lVar19) = puVar17;
        iVar9 = numSamples(*(int *)&cVar11._M_node[9].field_0x4,local_9c,iVar16);
        *(int *)((long)&pCVar22->nx + lVar19) = iVar9;
        iVar9 = numSamples(*(int *)&cVar11._M_node[9]._M_parent,a,uVar10);
        *(int *)((long)&pCVar22->ny + lVar19) = iVar9;
        puVar17 = puVar17 + (long)*(int *)((long)&pCVar22->size + lVar19) *
                            (long)iVar9 * (long)*(int *)((long)&pCVar22->nx + lVar19);
        cVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar11._M_node);
        CVar13 = ChannelList::end(this->_channels);
        lVar19 = lVar19 + 0x28;
      } while ((const_iterator)cVar11._M_node != CVar13._i._M_node);
    }
    uVar14 = (ulong)(uint)this->_numChans;
    local_f4 = inSize;
    local_a4 = uVar10;
    if (0 < this->_numChans) {
      lVar19 = 0;
      iVar25 = -0x7ffffff1;
      iVar28 = -0x80000000;
      iVar29 = -0x7ffffff1;
      iVar31 = -0x80000000;
      local_48 = -0x7ffffff1;
      iStack_44 = -0x7ffffff1;
      iStack_40 = -0x7ffffff1;
      iStack_3c = -0x7ffffff1;
      local_58 = -0x80000000;
      iStack_54 = -0x80000000;
      iStack_50 = -0x80000000;
      iStack_4c = -0x80000000;
      __src = local_b0;
      auVar45 = _DAT_02dca7d0;
      auVar46 = _DAT_02dca7e0;
      auVar37 = _DAT_02dca7f0;
      auVar47 = _DAT_00517f60;
      auVar48 = _DAT_02dca810;
      iVar16 = iVar25;
      iVar9 = iVar29;
      iVar49 = iVar28;
      iVar50 = iVar31;
      do {
        pCVar22 = this->_channelData + lVar19;
        if (pCVar22->type == HALF) {
          iVar26 = pCVar22->ny;
          if (0 < iVar26) {
            uVar10 = pCVar22->nx;
            local_a0 = 0;
            local_80 = pCVar22;
            local_60 = lVar19;
            do {
              if (0 < (int)uVar10) {
                puVar15 = pCVar22->start + uVar10 * local_a0;
                local_98 = puVar15 + uVar10;
                puVar17 = local_98 + uVar10;
                local_78 = puVar17 + uVar10;
                local_84 = local_a0 | 3;
                local_88 = local_a0 | 1;
                local_8c = local_a0 | 2;
                uVar18 = 0;
                do {
                  if (inSize < 3) goto LAB_0049f692;
                  bVar2 = (byte)__src[1];
                  if (bVar2 == 0xfc) {
                    uVar5 = (ushort)(byte)*__src << 8;
                    local_d8[0] = uVar5 & 0x7fff | (ushort)*(byte *)((long)__src + 1);
                    if (-1 < (short)uVar5) {
                      local_d8[0] = ~CONCAT11((byte)*__src,*(byte *)((long)__src + 1));
                    }
                    lVar19 = 0;
                    do {
                      auVar27._8_4_ = (int)lVar19;
                      auVar27._0_8_ = lVar19;
                      auVar27._12_4_ = (int)((ulong)lVar19 >> 0x20);
                      auVar32 = (auVar27 | auVar47) ^ auVar48;
                      iVar26 = auVar32._0_4_;
                      iVar30 = auVar32._8_4_;
                      auVar38._4_4_ = iVar26;
                      auVar38._0_4_ = iVar26;
                      auVar38._8_4_ = iVar30;
                      auVar38._12_4_ = iVar30;
                      auVar42._0_4_ = -(uint)(iVar26 < iVar25);
                      auVar42._4_4_ = -(uint)(iVar26 < iVar16);
                      auVar42._8_4_ = -(uint)(iVar30 < iVar29);
                      auVar42._12_4_ = -(uint)(iVar30 < iVar9);
                      auVar33._0_4_ = -(uint)(auVar32._4_4_ == iVar28);
                      auVar33._4_4_ = -(uint)(auVar32._4_4_ == iVar49);
                      auVar33._8_4_ = -(uint)(auVar32._12_4_ == iVar31);
                      auVar33._12_4_ = -(uint)(auVar32._12_4_ == iVar50);
                      auVar33 = auVar33 & auVar42;
                      auVar32 = pshuflw(auVar38,auVar33,0xe8);
                      auVar32 = packssdw(auVar32,auVar32);
                      if ((auVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        local_d8[lVar19 + 1] = local_d8[0];
                      }
                      auVar32 = packssdw(auVar33,auVar33);
                      auVar32 = packssdw(auVar32,auVar32);
                      if ((auVar32._0_4_ >> 0x10 & 1) != 0) {
                        local_d8[lVar19 + 2] = local_d8[0];
                      }
                      auVar32 = (auVar27 | auVar37) ^ auVar48;
                      iVar26 = auVar32._0_4_;
                      iVar30 = auVar32._8_4_;
                      auVar39._4_4_ = iVar26;
                      auVar39._0_4_ = iVar26;
                      auVar39._8_4_ = iVar30;
                      auVar39._12_4_ = iVar30;
                      auVar43._0_4_ = -(uint)(iVar26 < iVar25);
                      auVar43._4_4_ = -(uint)(iVar26 < iVar16);
                      auVar43._8_4_ = -(uint)(iVar30 < iVar29);
                      auVar43._12_4_ = -(uint)(iVar30 < iVar9);
                      auVar34._0_4_ = -(uint)(auVar32._4_4_ == iVar28);
                      auVar34._4_4_ = -(uint)(auVar32._4_4_ == iVar49);
                      auVar34._8_4_ = -(uint)(auVar32._12_4_ == iVar31);
                      auVar34._12_4_ = -(uint)(auVar32._12_4_ == iVar50);
                      auVar34 = auVar34 & auVar43;
                      auVar32 = packssdw(auVar39,auVar34);
                      auVar32 = packssdw(auVar32,auVar32);
                      if ((auVar32 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        local_d8[lVar19 + 3] = local_d8[0];
                      }
                      auVar32 = pshufhw(auVar34,auVar34,0x84);
                      auVar32 = packssdw(auVar32,auVar32);
                      if ((auVar32 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        local_d8[lVar19 + 4] = local_d8[0];
                      }
                      auVar32 = (auVar27 | auVar46) ^ auVar48;
                      iVar26 = auVar32._0_4_;
                      iVar30 = auVar32._8_4_;
                      auVar40._4_4_ = iVar26;
                      auVar40._0_4_ = iVar26;
                      auVar40._8_4_ = iVar30;
                      auVar40._12_4_ = iVar30;
                      auVar44._0_4_ = -(uint)(iVar26 < iVar25);
                      auVar44._4_4_ = -(uint)(iVar26 < iVar16);
                      auVar44._8_4_ = -(uint)(iVar30 < iVar29);
                      auVar44._12_4_ = -(uint)(iVar30 < iVar9);
                      auVar35._0_4_ = -(uint)(auVar32._4_4_ == iVar28);
                      auVar35._4_4_ = -(uint)(auVar32._4_4_ == iVar49);
                      auVar35._8_4_ = -(uint)(auVar32._12_4_ == iVar31);
                      auVar35._12_4_ = -(uint)(auVar32._12_4_ == iVar50);
                      auVar35 = auVar35 & auVar44;
                      auVar32 = pshuflw(auVar40,auVar35,0xe8);
                      auVar32 = packssdw(auVar32,auVar32);
                      if ((auVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        local_d8[lVar19 + 5] = local_d8[0];
                      }
                      auVar32 = packssdw(auVar35,auVar35);
                      auVar32 = packssdw(auVar32,auVar32);
                      if ((auVar32 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                        local_d8[lVar19 + 6] = local_d8[0];
                      }
                      auVar27 = (auVar27 | auVar45) ^ auVar48;
                      iVar26 = auVar27._0_4_;
                      iVar30 = auVar27._8_4_;
                      auVar36._4_4_ = iVar26;
                      auVar36._0_4_ = iVar26;
                      auVar36._8_4_ = iVar30;
                      auVar36._12_4_ = iVar30;
                      auVar41._0_4_ = -(uint)(iVar26 < iVar25);
                      auVar41._4_4_ = -(uint)(iVar26 < iVar16);
                      auVar41._8_4_ = -(uint)(iVar30 < iVar29);
                      auVar41._12_4_ = -(uint)(iVar30 < iVar9);
                      auVar32._0_4_ = -(uint)(auVar27._4_4_ == iVar28);
                      auVar32._4_4_ = -(uint)(auVar27._4_4_ == iVar49);
                      auVar32._8_4_ = -(uint)(auVar27._12_4_ == iVar31);
                      auVar32._12_4_ = -(uint)(auVar27._12_4_ == iVar50);
                      auVar32 = auVar32 & auVar41;
                      auVar27 = packssdw(auVar36,auVar32);
                      auVar27 = packssdw(auVar27,auVar27);
                      if ((auVar27 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        local_d8[lVar19 + 7] = local_d8[0];
                      }
                      auVar27 = pshufhw(auVar32,auVar32,0x84);
                      auVar27 = packssdw(auVar27,auVar27);
                      if ((auVar27 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        local_d8[lVar19 + 8] = local_d8[0];
                      }
                      lVar19 = lVar19 + 8;
                    } while (lVar19 != 0x10);
                    local_dc = -3;
                    local_70 = 3;
                  }
                  else {
                    if ((uint)inSize < 0xe) goto LAB_0049f692;
                    local_d8[0] = *__src << 8 | *__src >> 8;
                    bVar4 = bVar2 >> 2;
                    sVar8 = (short)(-0x20 << (bVar4 & 0x1f));
                    sVar7 = local_d8[0] + sVar8;
                    local_d8[4] = (short)(((bVar2 & 3) << 4 |
                                          (uint)(*(byte *)((long)__src + 3) >> 4)) << (bVar4 & 0x1f)
                                         ) + sVar7;
                    iVar16 = (uint)(byte)((byte)__src[2] >> 6) +
                             (*(byte *)((long)__src + 3) & 0xf) * 4;
                    sVar6 = local_d8[4] + sVar8;
                    local_d8[8] = (short)(iVar16 << (bVar4 & 0x1f)) + sVar6;
                    local_d8[0xc] =
                         (short)(((byte)__src[2] & 0x3f) + iVar16 + -0x20 << (bVar4 & 0x1f)) + sVar6
                    ;
                    local_d8[1] = ((ushort)(*(byte *)((long)__src + 5) >> 2) << (bVar4 & 0x1f)) +
                                  sVar7;
                    local_d8[5] = (short)(((*(byte *)((long)__src + 5) & 3) << 4 |
                                          (uint)(byte)((byte)__src[3] >> 4)) << (bVar4 & 0x1f)) +
                                  sVar6;
                    local_d8[9] = (short)((uint)(*(byte *)((long)__src + 7) >> 6) +
                                          ((byte)__src[3] & 0xf) * 4 << (bVar4 & 0x1f)) + sVar8 +
                                  local_d8[8];
                    local_d8[0xd] =
                         (short)((*(byte *)((long)__src + 7) & 0x3f) << (bVar4 & 0x1f)) + sVar8 +
                         local_d8[0xc];
                    local_d8[2] = ((ushort)(byte)((byte)__src[4] >> 2) << (bVar4 & 0x1f)) + sVar8 +
                                  local_d8[1];
                    local_d8[6] = (short)((((byte)__src[4] & 3) << 4 |
                                          (uint)(*(byte *)((long)__src + 9) >> 4)) << (bVar4 & 0x1f)
                                         ) + sVar8 + local_d8[5];
                    local_d8[10] = (short)((uint)(byte)((byte)__src[5] >> 6) +
                                           (*(byte *)((long)__src + 9) & 0xf) * 4 << (bVar4 & 0x1f))
                                   + sVar8 + local_d8[9];
                    local_d8[0xe] =
                         (short)(((byte)__src[5] & 0x3f) << (bVar4 & 0x1f)) + sVar8 + local_d8[0xd];
                    local_d8[3] = ((ushort)(*(byte *)((long)__src + 0xb) >> 2) << (bVar4 & 0x1f)) +
                                  sVar8 + local_d8[2];
                    local_d8[7] = (short)(((*(byte *)((long)__src + 0xb) & 3) << 4 |
                                          (uint)(byte)((byte)__src[6] >> 4)) << (bVar4 & 0x1f)) +
                                  sVar8 + local_d8[6];
                    local_d8[0xb] =
                         (short)((uint)(*(byte *)((long)__src + 0xd) >> 6) +
                                 ((byte)__src[6] & 0xf) * 4 << (bVar4 & 0x1f)) + sVar8 +
                         local_d8[10];
                    local_d8[0xf] =
                         (short)((*(byte *)((long)__src + 0xd) & 0x3f) << (bVar4 & 0x1f)) + sVar8 +
                         local_d8[0xe];
                    lVar19 = 0;
                    auVar45._8_4_ = 0xffffffff;
                    auVar45._0_8_ = 0xffffffffffffffff;
                    auVar45._12_4_ = 0xffffffff;
                    do {
                      auVar46 = *(undefined1 (*) [16])(local_d8 + lVar19);
                      auVar37._0_2_ = -(ushort)(auVar46._0_2_ < 0);
                      auVar37._2_2_ = -(ushort)(auVar46._2_2_ < 0);
                      auVar37._4_2_ = -(ushort)(auVar46._4_2_ < 0);
                      auVar37._6_2_ = -(ushort)(auVar46._6_2_ < 0);
                      auVar37._8_2_ = -(ushort)(auVar46._8_2_ < 0);
                      auVar37._10_2_ = -(ushort)(auVar46._10_2_ < 0);
                      auVar37._12_2_ = -(ushort)(auVar46._12_2_ < 0);
                      auVar37._14_2_ = -(ushort)(auVar46._14_2_ < 0);
                      *(undefined1 (*) [16])(local_d8 + lVar19) =
                           (auVar37 | auVar46) ^ auVar45 | auVar46 & auVar37 & _DAT_02dca7c0;
                      lVar19 = lVar19 + 8;
                    } while (lVar19 != 0x10);
                    local_dc = -0xe;
                    local_70 = 0xe;
                  }
                  if (pCVar22->pLinear == true) {
                    lVar19 = 0;
                    do {
                      local_d8[lVar19] =
                           *(ushort *)
                            ((anonymous_namespace)::logTable + (ulong)local_d8[lVar19] * 2);
                      lVar19 = lVar19 + 1;
                    } while (lVar19 != 0x10);
                  }
                  iVar16 = (pCVar22->nx - uVar18) * 2;
                  if ((int)(uVar18 | 3) < pCVar22->nx) {
                    iVar16 = 8;
                  }
                  sVar20 = (size_t)iVar16;
                  iVar16 = pCVar22->ny;
                  local_b0 = __src;
                  local_9c = uVar18;
                  memcpy(puVar15,local_d8,sVar20);
                  if ((int)local_84 < iVar16) {
                    memcpy(local_98,local_d8 + 4,sVar20);
                    memcpy(puVar17,local_d8 + 8,sVar20);
                    memcpy(local_78,local_d8 + 0xc,sVar20);
                  }
                  else {
                    iVar16 = pCVar22->ny;
                    if ((int)local_88 < iVar16) {
                      memcpy(local_98,local_d8 + 4,sVar20);
                      iVar16 = local_80->ny;
                      pCVar22 = local_80;
                    }
                    if ((int)local_8c < iVar16) {
                      memcpy(puVar17,local_d8 + 8,sVar20);
                      pCVar22 = local_80;
                    }
                  }
                  __src = (ushort *)((long)local_b0 + local_70);
                  inSize = inSize + local_dc;
                  puVar15 = puVar15 + 4;
                  local_98 = local_98 + 4;
                  puVar17 = puVar17 + 4;
                  local_78 = local_78 + 4;
                  uVar18 = local_9c + 4;
                  uVar10 = pCVar22->nx;
                  auVar45 = _DAT_02dca7d0;
                  auVar46 = _DAT_02dca7e0;
                  auVar37 = _DAT_02dca7f0;
                  auVar47 = _DAT_00517f60;
                  auVar48 = _DAT_02dca810;
                  iVar25 = local_48;
                  iVar16 = iStack_44;
                  iVar29 = iStack_40;
                  iVar9 = iStack_3c;
                  iVar28 = local_58;
                  iVar49 = iStack_54;
                  iVar31 = iStack_50;
                  iVar50 = iStack_4c;
                } while ((int)uVar18 < (int)uVar10);
                iVar26 = pCVar22->ny;
                lVar19 = local_60;
              }
              local_a0 = local_a0 + 4;
            } while ((int)local_a0 < iVar26);
          }
        }
        else {
          iVar9 = pCVar22->nx * pCVar22->ny * pCVar22->size;
          iVar16 = iVar9 * 2;
          if (inSize < iVar16) {
LAB_0049f692:
            anon_unknown_0::notEnoughData();
            goto LAB_0049f697;
          }
          memcpy(pCVar22->start,__src,(long)iVar16);
          __src = (ushort *)((long)__src + (long)iVar16);
          auVar45 = _DAT_02dca7d0;
          auVar46 = _DAT_02dca7e0;
          auVar37 = _DAT_02dca7f0;
          auVar47 = _DAT_00517f60;
          auVar48 = _DAT_02dca810;
          inSize = inSize + iVar9 * -2;
          iVar25 = local_48;
          iVar16 = iStack_44;
          iVar29 = iStack_40;
          iVar9 = iStack_3c;
          iVar28 = local_58;
          iVar49 = iStack_54;
          iVar31 = iStack_50;
          iVar50 = iStack_4c;
        }
        lVar19 = lVar19 + 1;
        uVar14 = (ulong)this->_numChans;
        local_f4 = inSize;
      } while (lVar19 < (long)uVar14);
    }
    puVar17 = (unsigned_short *)this->_outBuffer;
    if (this->_format == XDR) {
      if ((int)a <= (int)local_a4) {
        do {
          if (0 < (int)uVar14) {
            local_b0 = (ushort *)(ulong)~a;
            lVar19 = 0;
            do {
              pCVar22 = this->_channelData;
              uVar10 = pCVar22[lVar19].ys;
              if ((int)a < 0) {
                if (-1 < (int)uVar10) {
                  uVar18 = ((int)local_b0 + uVar10) / uVar10;
                  goto LAB_0049f4bd;
                }
                uVar18 = (~uVar10 - a) / -uVar10;
              }
              else if ((int)uVar10 < 0) {
                uVar18 = a / -uVar10;
LAB_0049f4bd:
                uVar18 = -uVar18;
              }
              else {
                uVar18 = a / uVar10;
              }
              if (a == uVar18 * uVar10) {
                iVar16 = pCVar22[lVar19].nx;
                if (pCVar22[lVar19].type == HALF) {
                  if (0 < iVar16) {
                    puVar15 = pCVar22[lVar19].end;
                    uVar10 = iVar16 + 1;
                    do {
                      *puVar17 = *puVar15;
                      puVar17 = puVar17 + 1;
                      puVar15 = pCVar22[lVar19].end + 1;
                      pCVar22[lVar19].end = puVar15;
                      uVar10 = uVar10 - 1;
                    } while (1 < uVar10);
                  }
                }
                else {
                  lVar21 = (long)pCVar22[lVar19].size * (long)iVar16;
                  memcpy(puVar17,pCVar22[lVar19].end,lVar21 * 2);
                  puVar17 = puVar17 + lVar21;
                  pCVar22[lVar19].end = pCVar22[lVar19].end + lVar21;
                }
              }
              lVar19 = lVar19 + 1;
              uVar14 = (ulong)this->_numChans;
            } while (lVar19 < (long)uVar14);
          }
          bVar24 = a != local_a4;
          a = a + 1;
        } while (bVar24);
      }
    }
    else if ((int)a <= (int)local_a4) {
      do {
        if (0 < (int)uVar14) {
          local_b0 = (ushort *)(ulong)~a;
          lVar19 = 8;
          lVar21 = 0;
          do {
            pCVar22 = this->_channelData;
            uVar10 = *(uint *)((long)&pCVar22->nx + lVar19);
            if ((int)a < 0) {
              if ((int)uVar10 < 0) {
                uVar18 = (~uVar10 - a) / -uVar10;
              }
              else {
                uVar18 = -(((int)local_b0 + uVar10) / uVar10);
              }
            }
            else if ((int)uVar10 < 0) {
              uVar18 = -(a / -uVar10);
            }
            else {
              uVar18 = a / uVar10;
            }
            if (a == uVar18 * uVar10) {
              lVar23 = (long)*(int *)((long)&pCVar22->type + lVar19) *
                       (long)*(int *)((long)&pCVar22->end + lVar19);
              sVar20 = lVar23 * 2;
              memcpy(puVar17,*(void **)((long)&pCVar22->start + lVar19),sVar20);
              puVar17 = puVar17 + lVar23;
              plVar1 = (long *)((long)&pCVar22->start + lVar19);
              *plVar1 = *plVar1 + sVar20;
              uVar14 = (ulong)(uint)this->_numChans;
            }
            lVar21 = lVar21 + 1;
            lVar19 = lVar19 + 0x28;
          } while (lVar21 < (int)uVar14);
        }
        bVar24 = a != local_a4;
        a = a + 1;
      } while (bVar24);
    }
    if (0 < (int)local_f4) {
LAB_0049f697:
      this_00 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc
                (this_00,"Error decompressing data (input data are longer than expected).");
      __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
    }
    pcVar3 = this->_outBuffer;
    *local_68 = pcVar3;
    iVar16 = (int)puVar17 - (int)pcVar3;
  }
  return iVar16;
}

Assistant:

int
B44Compressor::uncompress (const char *inPtr,
			   int inSize,
			   IMATH_NAMESPACE::Box2i range,
			   const char *&outPtr)
{
    //
    // This function is the reverse of the compress() function,
    // above.  First all pixels are moved from the input buffer
    // into _tmpBuffer.  UINT and FLOAT channels are copied
    // verbatim; HALF channels are uncompressed in blocks of
    // 4x4 pixels.  Then the pixels in _tmpBuffer are copied
    // into the output buffer and rearranged such that the data
    // for for each scan line form a contiguous block.
    //

    outPtr = _outBuffer;

    if (inSize == 0)
    {
	return 0;
    }

    int minX = range.min.x;
    int maxX = min (range.max.x, _maxX);
    int minY = range.min.y;
    int maxY = min (range.max.y, _maxY);
    
    unsigned short *tmpBufferEnd = _tmpBuffer;
    int i = 0;

    for (ChannelList::ConstIterator c = _channels.begin();
	 c != _channels.end();
	 ++c, ++i)
    {
	ChannelData &cd = _channelData[i];

	cd.start = tmpBufferEnd;
	cd.end = cd.start;

	cd.nx = numSamples (c.channel().xSampling, minX, maxX);
	cd.ny = numSamples (c.channel().ySampling, minY, maxY);

	tmpBufferEnd += cd.nx * cd.ny * cd.size;
    }

    for (int i = 0; i < _numChans; ++i)
    {
	ChannelData &cd = _channelData[i];

	if (cd.type != HALF)
	{
	    //
	    // UINT or FLOAT channel.
	    //

	    int n = cd.nx * cd.ny * cd.size * sizeof (unsigned short);

	    if (inSize < n)
		notEnoughData();

	    memcpy (cd.start, inPtr, n);
	    inPtr += n;
	    inSize -= n;

	    continue;
	}

	//
	// HALF channel
	//

	for (int y = 0; y < cd.ny; y += 4)
	{
	    unsigned short *row0 = cd.start + y * cd.nx;
	    unsigned short *row1 = row0 + cd.nx;
	    unsigned short *row2 = row1 + cd.nx;
	    unsigned short *row3 = row2 + cd.nx;

	    for (int x = 0; x < cd.nx; x += 4)
	    {
		unsigned short s[16]; 

		if (inSize < 3)
		    notEnoughData();

		if (((const unsigned char *)inPtr)[2] == 0xfc)
		{
		    unpack3 ((const unsigned char *)inPtr, s);
		    inPtr += 3;
		    inSize -= 3;
		}
		else
		{
		    if (inSize < 14)
			notEnoughData();

		    unpack14 ((const unsigned char *)inPtr, s);
		    inPtr += 14;
		    inSize -= 14;
		}

		if (cd.pLinear)
		    convertToLinear (s);

		int n = (x + 3 < cd.nx)?
			    4 * sizeof (unsigned short) :
			    (cd.nx - x) * sizeof (unsigned short);

		if (y + 3 < cd.ny)
		{
		    memcpy (row0, &s[ 0], n);
		    memcpy (row1, &s[ 4], n);
		    memcpy (row2, &s[ 8], n);
		    memcpy (row3, &s[12], n);
		}
		else
		{
		    memcpy (row0, &s[ 0], n);

		    if (y + 1 < cd.ny)
			memcpy (row1, &s[ 4], n);

		    if (y + 2 < cd.ny)
			memcpy (row2, &s[ 8], n);
		}

		row0 += 4;
		row1 += 4;
		row2 += 4;
		row3 += 4;
	    }
	}
    }

    char *outEnd = _outBuffer;

    if (_format == XDR)
    {
	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		if (cd.type == HALF)
		{
		    for (int x = cd.nx; x > 0; --x)
		    {
			Xdr::write <CharPtrIO> (outEnd, *cd.end);
			++cd.end;
		    }
		}
		else
		{
		    int n = cd.nx * cd.size;
		    memcpy (outEnd, cd.end, n * sizeof (unsigned short));
		    outEnd += n * sizeof (unsigned short);
		    cd.end += n;
		}
	    }
	}
    }
    else
    {
	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		#if defined (DEBUG)
		    assert (cd.type == HALF);
		#endif

		if (modp (y, cd.ys) != 0)
		    continue;

		int n = cd.nx * cd.size;
		memcpy (outEnd, cd.end, n * sizeof (unsigned short));
		outEnd += n * sizeof (unsigned short);
		cd.end += n;
	    }
	}
    }

    #if defined (DEBUG)

	for (int i = 1; i < _numChans; ++i)
	    assert (_channelData[i-1].end == _channelData[i].start);

	assert (_channelData[_numChans-1].end == tmpBufferEnd);

    #endif

    if (inSize > 0)
	tooMuchData();

    outPtr = _outBuffer;
    return outEnd - _outBuffer;
}